

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O0

int IPdr_ManSolveInt(Pdr_Man_t *p,int fCheckClauses,int fPushClauses)

{
  _func_int_int_Abc_Cex_t_ptr *p_Var1;
  long lVar2;
  bool bVar3;
  Pdr_Man_t *pPVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  abctime aVar11;
  abctime aVar12;
  Aig_Obj_t *pAVar13;
  Vec_Int_t *pVVar14;
  Aig_Obj_t *pAVar15;
  Aig_Obj_t *pAVar16;
  Abc_Cex_t *pAVar17;
  abctime aVar18;
  Vec_Ptr_t *pVVar19;
  void *pvVar20;
  long local_1f0;
  Abc_Cex_t *local_1b8;
  Abc_Cex_t *local_1a0;
  Abc_Cex_t *local_148;
  Abc_Cex_t *local_108;
  long local_a8;
  int local_9c;
  int local_98;
  int k;
  int j;
  int i;
  Pdr_Set_t *pSet;
  abctime timeSince;
  Abc_Cex_t *pCex;
  abctime clk;
  abctime aStack_68;
  int fRefined;
  abctime clkOne;
  abctime clkStart;
  int nOutDigits;
  int RetValue;
  int iFrame;
  Abc_Cex_t *pCexNew;
  Aig_Obj_t *pObj;
  Pdr_Set_t *pCube;
  int local_28;
  int fPrintClauses;
  int fPushClauses_local;
  int fCheckClauses_local;
  Pdr_Man_t *p_local;
  
  pCube._4_4_ = 0;
  pObj = (Aig_Obj_t *)0x0;
  local_28 = fPushClauses;
  fPrintClauses = fCheckClauses;
  _fPushClauses_local = p;
  uVar5 = Saig_ManPoNum(p->pAig);
  uVar5 = Abc_Base10Log(uVar5);
  aVar11 = Abc_Clock();
  aStack_68 = 0;
  if (_fPushClauses_local->pPars->nTimeOut == 0) {
    local_a8 = 0;
  }
  else {
    iVar6 = _fPushClauses_local->pPars->nTimeOut;
    aVar12 = Abc_Clock();
    local_a8 = (long)iVar6 * 1000000 + aVar12;
  }
  _fPushClauses_local->timeToStop = local_a8;
  if (_fPushClauses_local->pPars->fSolveAll != 0) {
    for (nOutDigits = 0; iVar6 = Saig_ManPoNum(_fPushClauses_local->pAig), nOutDigits < iVar6;
        nOutDigits = nOutDigits + 1) {
      pAVar13 = (Aig_Obj_t *)Vec_PtrEntry(_fPushClauses_local->pAig->vCos,nOutDigits);
      pAVar13 = Aig_ObjChild0(pAVar13);
      pAVar15 = Aig_ManConst0(_fPushClauses_local->pAig);
      if (pAVar13 == pAVar15) {
        Vec_IntWriteEntry(_fPushClauses_local->pPars->vOutMap,nOutDigits,1);
        _fPushClauses_local->pPars->nProveOuts = _fPushClauses_local->pPars->nProveOuts + 1;
        if (_fPushClauses_local->pPars->fUseBridge != 0) {
          Gia_ManToBridgeResult(_stdout,1,(Abc_Cex_t *)0x0,nOutDigits);
        }
      }
    }
  }
  aVar12 = Abc_Clock();
  _fPushClauses_local->pPars->timeLastSolved = aVar12;
  iVar6 = Vec_VecSize(_fPushClauses_local->vClauses);
  if (iVar6 == 0) {
    nOutDigits = 0;
    Pdr_ManCreateSolver(_fPushClauses_local,0);
  }
  else {
    uVar7 = Vec_VecSize(_fPushClauses_local->vClauses);
    nOutDigits = uVar7 - 1;
    if (fPrintClauses != 0) {
      if (_fPushClauses_local->pPars->fVerbose != 0) {
        Abc_Print(1,"IPDR: Checking the reloaded length-%d trace...",(ulong)uVar7);
      }
      IPdr_ManCheckClauses(_fPushClauses_local);
      if (_fPushClauses_local->pPars->fVerbose != 0) {
        Abc_Print(1," Passed!\n");
      }
    }
    if (local_28 != 0) {
      iVar6 = Abc_MaxInt(nOutDigits,1);
      _fPushClauses_local->iUseFrame = iVar6;
      if (_fPushClauses_local->pPars->fVerbose != 0) {
        Abc_Print(1,"IPDR: Pushing the reloaded clauses. Before:\n");
        pPVar4 = _fPushClauses_local;
        aVar12 = Abc_Clock();
        Pdr_ManPrintProgress(pPVar4,1,aVar12 - aVar11);
      }
      iVar6 = Pdr_ManPushClauses(_fPushClauses_local);
      if (_fPushClauses_local->pPars->fVerbose != 0) {
        Abc_Print(1,"IPDR: Finished pushing. After:\n");
        pPVar4 = _fPushClauses_local;
        aVar12 = Abc_Clock();
        Pdr_ManPrintProgress(pPVar4,1,aVar12 - aVar11);
      }
      if (iVar6 != 0) {
        Pdr_ManReportInvariant(_fPushClauses_local);
        Pdr_ManVerifyInvariant(_fPushClauses_local);
        return 1;
      }
    }
    if (((_fPushClauses_local->pPars->fUseAbs != 0) &&
        (_fPushClauses_local->vAbsFlops == (Vec_Int_t *)0x0)) && (0 < nOutDigits)) {
      if (_fPushClauses_local->vAbsFlops != (Vec_Int_t *)0x0) {
        __assert_fail("p->vAbsFlops == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                      ,0x1b7,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
      }
      iVar6 = Saig_ManRegNum(_fPushClauses_local->pAig);
      pVVar14 = Vec_IntStart(iVar6);
      _fPushClauses_local->vAbsFlops = pVVar14;
      iVar6 = Saig_ManRegNum(_fPushClauses_local->pAig);
      pVVar14 = Vec_IntStartFull(iVar6);
      _fPushClauses_local->vMapFf2Ppi = pVVar14;
      pVVar14 = Vec_IntAlloc(100);
      _fPushClauses_local->vMapPpi2Ff = pVVar14;
      IPdr_ManRestoreAbsFlops(_fPushClauses_local);
    }
  }
  do {
    bVar3 = false;
    if (((_fPushClauses_local->pPars->fUseAbs != 0) &&
        (_fPushClauses_local->vAbsFlops == (Vec_Int_t *)0x0)) && (nOutDigits == 1)) {
      if (_fPushClauses_local->vAbsFlops != (Vec_Int_t *)0x0) {
        __assert_fail("p->vAbsFlops == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                      ,0x1c6,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
      }
      iVar6 = Saig_ManRegNum(_fPushClauses_local->pAig);
      pVVar14 = Vec_IntStart(iVar6);
      _fPushClauses_local->vAbsFlops = pVVar14;
      iVar6 = Saig_ManRegNum(_fPushClauses_local->pAig);
      pVVar14 = Vec_IntStartFull(iVar6);
      _fPushClauses_local->vMapFf2Ppi = pVVar14;
      pVVar14 = Vec_IntAlloc(100);
      _fPushClauses_local->vMapPpi2Ff = pVVar14;
    }
    _fPushClauses_local->nFrames = nOutDigits;
    iVar6 = Vec_PtrSize(_fPushClauses_local->vSolvers);
    if (nOutDigits != iVar6 + -1) {
      __assert_fail("iFrame == Vec_PtrSize(p->vSolvers)-1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                    ,0x1d1,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
    }
    iVar6 = Abc_MaxInt(nOutDigits,1);
    _fPushClauses_local->iUseFrame = iVar6;
    _fPushClauses_local->iOutCur = 0;
    while (iVar6 = _fPushClauses_local->iOutCur, iVar8 = Saig_ManPoNum(_fPushClauses_local->pAig),
          iVar6 < iVar8) {
      pAVar13 = (Aig_Obj_t *)
                Vec_PtrEntry(_fPushClauses_local->pAig->vCos,_fPushClauses_local->iOutCur);
      if (((_fPushClauses_local->vCexes == (Vec_Ptr_t *)0x0) ||
          (pvVar20 = Vec_PtrEntry(_fPushClauses_local->vCexes,_fPushClauses_local->iOutCur),
          pvVar20 == (void *)0x0)) &&
         ((_fPushClauses_local->pTime4Outs == (abctime *)0x0 ||
          (_fPushClauses_local->pTime4Outs[_fPushClauses_local->iOutCur] != 0)))) {
        pAVar15 = Aig_ObjChild0(pAVar13);
        pAVar16 = Aig_ManConst0(_fPushClauses_local->pAig);
        if (pAVar15 != pAVar16) {
          pAVar13 = Aig_ObjChild0(pAVar13);
          pAVar15 = Aig_ManConst1(_fPushClauses_local->pAig);
          if (pAVar13 == pAVar15) {
            if (_fPushClauses_local->pPars->fSolveAll == 0) {
              iVar6 = Aig_ManRegNum(_fPushClauses_local->pAig);
              iVar8 = Saig_ManPiNum(_fPushClauses_local->pAig);
              iVar9 = Saig_ManPoNum(_fPushClauses_local->pAig);
              iVar10 = Saig_ManPoNum(_fPushClauses_local->pAig);
              pAVar17 = Abc_CexMakeTriv(iVar6,iVar8,iVar9,
                                        nOutDigits * iVar10 + _fPushClauses_local->iOutCur);
              _fPushClauses_local->pAig->pSeqModel = pAVar17;
              return 0;
            }
            if ((_fPushClauses_local->pPars->fUseBridge == 0) &&
               (_fPushClauses_local->pPars->fStoreCex == 0)) {
              local_108 = (Abc_Cex_t *)0x1;
            }
            else {
              iVar6 = Aig_ManRegNum(_fPushClauses_local->pAig);
              iVar8 = Saig_ManPiNum(_fPushClauses_local->pAig);
              iVar9 = Saig_ManPoNum(_fPushClauses_local->pAig);
              iVar10 = Saig_ManPoNum(_fPushClauses_local->pAig);
              local_108 = Abc_CexMakeTriv(iVar6,iVar8,iVar9,
                                          nOutDigits * iVar10 + _fPushClauses_local->iOutCur);
            }
            _fPushClauses_local->pPars->nFailOuts = _fPushClauses_local->pPars->nFailOuts + 1;
            if (_fPushClauses_local->pPars->vOutMap != (Vec_Int_t *)0x0) {
              Vec_IntWriteEntry(_fPushClauses_local->pPars->vOutMap,_fPushClauses_local->iOutCur,0);
            }
            if (_fPushClauses_local->pPars->fNotVerbose == 0) {
              uVar7 = _fPushClauses_local->iOutCur;
              iVar6 = _fPushClauses_local->pPars->nFailOuts;
              iVar8 = Saig_ManPoNum(_fPushClauses_local->pAig);
              Abc_Print(1,
                        "Output %*d was trivially asserted in frame %2d (solved %*d out of %*d outputs).\n"
                        ,(ulong)uVar5,(ulong)uVar7,(ulong)(uint)nOutDigits,(ulong)uVar5,iVar6,uVar5,
                        iVar8);
            }
            pvVar20 = Vec_PtrEntry(_fPushClauses_local->vCexes,_fPushClauses_local->iOutCur);
            if (pvVar20 != (void *)0x0) {
              __assert_fail("Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                            ,0x1ed,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
            }
            if (_fPushClauses_local->pPars->fUseBridge != 0) {
              Gia_ManToBridgeResult(_stdout,0,local_108,local_108->iPo);
            }
            Vec_PtrWriteEntry(_fPushClauses_local->vCexes,_fPushClauses_local->iOutCur,local_108);
            if (_fPushClauses_local->pPars->pFuncOnFail != (_func_int_int_Abc_Cex_t_ptr *)0x0) {
              p_Var1 = _fPushClauses_local->pPars->pFuncOnFail;
              iVar6 = _fPushClauses_local->iOutCur;
              if (_fPushClauses_local->pPars->fStoreCex == 0) {
                local_148 = (Abc_Cex_t *)0x0;
              }
              else {
                local_148 = (Abc_Cex_t *)
                            Vec_PtrEntry(_fPushClauses_local->vCexes,_fPushClauses_local->iOutCur);
              }
              iVar6 = (*p_Var1)(iVar6,local_148);
              pPVar4 = _fPushClauses_local;
              if (iVar6 != 0) {
                if (_fPushClauses_local->pPars->fVerbose != 0) {
                  aVar12 = Abc_Clock();
                  Pdr_ManPrintProgress(pPVar4,1,aVar12 - aVar11);
                }
                if (_fPushClauses_local->pPars->fSilent == 0) {
                  Abc_Print(1,"Quitting due to callback on fail in frame %d.\n",
                            (ulong)(uint)nOutDigits);
                }
                _fPushClauses_local->pPars->iFrame = nOutDigits;
                return -1;
              }
            }
            iVar6 = _fPushClauses_local->pPars->nFailOuts;
            iVar8 = _fPushClauses_local->pPars->nDropOuts;
            iVar9 = Saig_ManPoNum(_fPushClauses_local->pAig);
            if (iVar6 + iVar8 == iVar9) {
              if (_fPushClauses_local->pPars->nFailOuts == 0) {
                return -1;
              }
              return 0;
            }
            aVar12 = Abc_Clock();
            _fPushClauses_local->pPars->timeLastSolved = aVar12;
          }
          else {
            if (_fPushClauses_local->pTime4Outs != (abctime *)0x0) {
              if (_fPushClauses_local->pTime4Outs[_fPushClauses_local->iOutCur] < 1) {
                __assert_fail("p->pTime4Outs[p->iOutCur] > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                              ,0x202,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
              }
              aStack_68 = Abc_Clock();
              lVar2 = _fPushClauses_local->pTime4Outs[_fPushClauses_local->iOutCur];
              aVar12 = Abc_Clock();
              _fPushClauses_local->timeToStopOne = lVar2 + aVar12;
            }
            while( true ) {
              if (((_fPushClauses_local->pPars->nTimeOutGap != 0) &&
                  (_fPushClauses_local->pPars->timeLastSolved != 0)) &&
                 (aVar12 = Abc_Clock(), pPVar4 = _fPushClauses_local,
                 _fPushClauses_local->pPars->timeLastSolved +
                 (long)_fPushClauses_local->pPars->nTimeOutGap * 1000000 < aVar12)) {
                if (_fPushClauses_local->pPars->fVerbose != 0) {
                  aVar12 = Abc_Clock();
                  Pdr_ManPrintProgress(pPVar4,1,aVar12 - aVar11);
                }
                if (_fPushClauses_local->pPars->fSilent == 0) {
                  Abc_Print(1,"Reached gap timeout (%d seconds) in frame %d.\n",
                            (ulong)(uint)_fPushClauses_local->pPars->nTimeOutGap,
                            (ulong)(uint)nOutDigits);
                }
                _fPushClauses_local->pPars->iFrame = nOutDigits;
                return -1;
              }
              iVar6 = Pdr_ManCheckCube(_fPushClauses_local,nOutDigits,(Pdr_Set_t *)0x0,
                                       (Pdr_Set_t **)&pObj,_fPushClauses_local->pPars->nConfLimit,0,
                                       1);
              pPVar4 = _fPushClauses_local;
              if (iVar6 == 1) goto LAB_00be7497;
              if (iVar6 == -1) break;
              if (iVar6 == 0) {
                iVar6 = Pdr_ManBlockCube(_fPushClauses_local,(Pdr_Set_t *)pObj);
                pPVar4 = _fPushClauses_local;
                if (iVar6 == -1) {
                  if (_fPushClauses_local->pPars->fVerbose != 0) {
                    aVar12 = Abc_Clock();
                    Pdr_ManPrintProgress(pPVar4,1,aVar12 - aVar11);
                  }
                  if ((_fPushClauses_local->timeToStop == 0) ||
                     (aVar12 = Abc_Clock(), aVar12 <= _fPushClauses_local->timeToStop)) {
                    if ((_fPushClauses_local->pPars->nTimeOutGap == 0) ||
                       ((_fPushClauses_local->pPars->timeLastSolved == 0 ||
                        (aVar12 = Abc_Clock(),
                        aVar12 <= _fPushClauses_local->pPars->timeLastSolved +
                                  (long)_fPushClauses_local->pPars->nTimeOutGap * 1000000)))) {
                      if ((_fPushClauses_local->timeToStopOne != 0) &&
                         (aVar12 = Abc_Clock(), _fPushClauses_local->timeToStopOne < aVar12)) {
                        Pdr_QueueClean(_fPushClauses_local);
                        pObj = (Aig_Obj_t *)0x0;
                        goto LAB_00be7497;
                      }
                      if (_fPushClauses_local->pPars->nConfLimit == 0) {
                        if (_fPushClauses_local->pPars->fVerbose != 0) {
                          Abc_Print(1,"Computation cancelled by the callback in frame %d.\n",
                                    (ulong)(uint)nOutDigits);
                        }
                      }
                      else {
                        Abc_Print(1,"Reached conflict limit (%d) in frame %d.\n",
                                  (ulong)(uint)_fPushClauses_local->pPars->nConfLimit,
                                  (ulong)(uint)nOutDigits);
                      }
                    }
                    else {
                      Abc_Print(1,"Reached gap timeout (%d seconds) in frame %d.\n",
                                (ulong)(uint)_fPushClauses_local->pPars->nTimeOutGap,
                                (ulong)(uint)nOutDigits);
                    }
                  }
                  else {
                    Abc_Print(1,"Reached timeout (%d seconds) in frame %d.\n",
                              (ulong)(uint)_fPushClauses_local->pPars->nTimeOut,
                              (ulong)(uint)nOutDigits);
                  }
                  _fPushClauses_local->pPars->iFrame = nOutDigits;
                  return -1;
                }
                if (iVar6 == 0) {
                  if (pCube._4_4_ != 0) {
                    Abc_Print(1,"*** Clauses after frame %d:\n",(ulong)(uint)nOutDigits);
                    Pdr_ManPrintClauses(_fPushClauses_local,0);
                  }
                  pPVar4 = _fPushClauses_local;
                  if ((_fPushClauses_local->pPars->fVerbose != 0) &&
                     (_fPushClauses_local->pPars->fUseAbs == 0)) {
                    iVar6 = _fPushClauses_local->pPars->fSolveAll;
                    aVar12 = Abc_Clock();
                    Pdr_ManPrintProgress(pPVar4,(uint)((iVar6 != 0 ^ 0xffU) & 1),aVar12 - aVar11);
                  }
                  _fPushClauses_local->pPars->iFrame = nOutDigits;
                  if (_fPushClauses_local->pPars->fSolveAll == 0) {
                    aVar12 = Abc_Clock();
                    pAVar17 = Pdr_ManDeriveCexAbs(_fPushClauses_local);
                    aVar18 = Abc_Clock();
                    pPVar4 = _fPushClauses_local;
                    _fPushClauses_local->tAbs = (aVar18 - aVar12) + _fPushClauses_local->tAbs;
                    if (pAVar17 != (Abc_Cex_t *)0x0) {
                      _fPushClauses_local->pAig->pSeqModel = pAVar17;
                      if ((_fPushClauses_local->pPars->fVerbose != 0) &&
                         (_fPushClauses_local->pPars->fUseAbs != 0)) {
                        iVar6 = _fPushClauses_local->pPars->fSolveAll;
                        aVar12 = Abc_Clock();
                        Pdr_ManPrintProgress
                                  (pPVar4,(uint)((iVar6 != 0 ^ 0xffU) & 1),aVar12 - aVar11);
                      }
                      return 0;
                    }
                    if (_fPushClauses_local->pPars->fUseAbs == 0) {
                      __assert_fail("p->pPars->fUseAbs",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                    ,0x252,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                    }
                    Pdr_QueueClean(_fPushClauses_local);
                    pObj = (Aig_Obj_t *)0x0;
                    bVar3 = true;
                  }
                  else {
                    _fPushClauses_local->pPars->nFailOuts =
                         _fPushClauses_local->pPars->nFailOuts + 1;
                    if ((_fPushClauses_local->pPars->fUseBridge == 0) &&
                       (_fPushClauses_local->pPars->fStoreCex == 0)) {
                      local_1a0 = (Abc_Cex_t *)0x1;
                    }
                    else {
                      local_1a0 = Pdr_ManDeriveCex(_fPushClauses_local);
                    }
                    if (_fPushClauses_local->pPars->vOutMap != (Vec_Int_t *)0x0) {
                      Vec_IntWriteEntry(_fPushClauses_local->pPars->vOutMap,
                                        _fPushClauses_local->iOutCur,0);
                    }
                    pvVar20 = Vec_PtrEntry(_fPushClauses_local->vCexes,_fPushClauses_local->iOutCur)
                    ;
                    if (pvVar20 != (void *)0x0) {
                      __assert_fail("Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                                    ,0x261,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
                    }
                    if (_fPushClauses_local->pPars->fUseBridge != 0) {
                      Gia_ManToBridgeResult(_stdout,0,local_1a0,local_1a0->iPo);
                    }
                    Vec_PtrWriteEntry(_fPushClauses_local->vCexes,_fPushClauses_local->iOutCur,
                                      local_1a0);
                    if (_fPushClauses_local->pPars->pFuncOnFail !=
                        (_func_int_int_Abc_Cex_t_ptr *)0x0) {
                      p_Var1 = _fPushClauses_local->pPars->pFuncOnFail;
                      iVar6 = _fPushClauses_local->iOutCur;
                      if (_fPushClauses_local->pPars->fStoreCex == 0) {
                        local_1b8 = (Abc_Cex_t *)0x0;
                      }
                      else {
                        local_1b8 = (Abc_Cex_t *)
                                    Vec_PtrEntry(_fPushClauses_local->vCexes,
                                                 _fPushClauses_local->iOutCur);
                      }
                      iVar6 = (*p_Var1)(iVar6,local_1b8);
                      pPVar4 = _fPushClauses_local;
                      if (iVar6 != 0) {
                        if (_fPushClauses_local->pPars->fVerbose != 0) {
                          aVar12 = Abc_Clock();
                          Pdr_ManPrintProgress(pPVar4,1,aVar12 - aVar11);
                        }
                        if (_fPushClauses_local->pPars->fSilent == 0) {
                          Abc_Print(1,"Quitting due to callback on fail in frame %d.\n",
                                    (ulong)(uint)nOutDigits);
                        }
                        _fPushClauses_local->pPars->iFrame = nOutDigits;
                        return -1;
                      }
                    }
                    if (_fPushClauses_local->pPars->fNotVerbose == 0) {
                      uVar7 = _fPushClauses_local->iOutCur;
                      iVar6 = _fPushClauses_local->pPars->nFailOuts;
                      iVar8 = Saig_ManPoNum(_fPushClauses_local->pAig);
                      Abc_Print(1,
                                "Output %*d was asserted in frame %2d (%2d) (solved %*d out of %*d outputs).\n"
                                ,(ulong)uVar5,(ulong)uVar7,(ulong)(uint)nOutDigits,
                                (ulong)(uint)nOutDigits,uVar5,iVar6,uVar5,iVar8);
                    }
                    iVar6 = _fPushClauses_local->pPars->nFailOuts;
                    iVar8 = Saig_ManPoNum(_fPushClauses_local->pAig);
                    if (iVar6 == iVar8) {
                      return 0;
                    }
                    Pdr_QueueClean(_fPushClauses_local);
                    pObj = (Aig_Obj_t *)0x0;
                  }
                  goto LAB_00be7497;
                }
                if (_fPushClauses_local->pPars->fVerbose != 0) {
                  aVar12 = Abc_Clock();
                  Pdr_ManPrintProgress(pPVar4,0,aVar12 - aVar11);
                }
              }
            }
            if (_fPushClauses_local->pPars->fVerbose != 0) {
              aVar12 = Abc_Clock();
              Pdr_ManPrintProgress(pPVar4,1,aVar12 - aVar11);
            }
            if ((_fPushClauses_local->timeToStop != 0) &&
               (aVar12 = Abc_Clock(), _fPushClauses_local->timeToStop < aVar12)) {
              Abc_Print(1,"Reached timeout (%d seconds) in frame %d.\n",
                        (ulong)(uint)_fPushClauses_local->pPars->nTimeOut,(ulong)(uint)nOutDigits);
LAB_00be6ddb:
              _fPushClauses_local->pPars->iFrame = nOutDigits;
              return -1;
            }
            if ((_fPushClauses_local->pPars->nTimeOutGap != 0) &&
               ((_fPushClauses_local->pPars->timeLastSolved != 0 &&
                (aVar12 = Abc_Clock(),
                _fPushClauses_local->pPars->timeLastSolved +
                (long)_fPushClauses_local->pPars->nTimeOutGap * 1000000 < aVar12)))) {
              Abc_Print(1,"Reached gap timeout (%d seconds) in frame %d.\n",
                        (ulong)(uint)_fPushClauses_local->pPars->nTimeOutGap,(ulong)(uint)nOutDigits
                       );
              goto LAB_00be6ddb;
            }
            if ((_fPushClauses_local->timeToStopOne == 0) ||
               (aVar12 = Abc_Clock(), aVar12 <= _fPushClauses_local->timeToStopOne)) {
              if (_fPushClauses_local->pPars->nConfLimit == 0) {
                if (_fPushClauses_local->pPars->fVerbose != 0) {
                  Abc_Print(1,"Computation cancelled by the callback in frame %d.\n",
                            (ulong)(uint)nOutDigits);
                }
              }
              else {
                Abc_Print(1,"Reached conflict limit (%d) in frame %d.\n",
                          (ulong)(uint)_fPushClauses_local->pPars->nConfLimit,
                          (ulong)(uint)nOutDigits);
              }
              goto LAB_00be6ddb;
            }
            Pdr_QueueClean(_fPushClauses_local);
            pObj = (Aig_Obj_t *)0x0;
LAB_00be7497:
            if (bVar3) break;
            if (_fPushClauses_local->pTime4Outs != (abctime *)0x0) {
              aVar12 = Abc_Clock();
              if (_fPushClauses_local->pTime4Outs[_fPushClauses_local->iOutCur] < 1) {
                __assert_fail("p->pTime4Outs[p->iOutCur] > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                              ,0x280,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
              }
              if (aVar12 - aStack_68 < _fPushClauses_local->pTime4Outs[_fPushClauses_local->iOutCur]
                 ) {
                local_1f0 = _fPushClauses_local->pTime4Outs[_fPushClauses_local->iOutCur] -
                            (aVar12 - aStack_68);
              }
              else {
                local_1f0 = 0;
              }
              _fPushClauses_local->pTime4Outs[_fPushClauses_local->iOutCur] = local_1f0;
              if ((_fPushClauses_local->pTime4Outs[_fPushClauses_local->iOutCur] == 0) &&
                 (pvVar20 = Vec_PtrEntry(_fPushClauses_local->vCexes,_fPushClauses_local->iOutCur),
                 pvVar20 == (void *)0x0)) {
                _fPushClauses_local->pPars->nDropOuts = _fPushClauses_local->pPars->nDropOuts + 1;
                if (_fPushClauses_local->pPars->vOutMap != (Vec_Int_t *)0x0) {
                  Vec_IntWriteEntry(_fPushClauses_local->pPars->vOutMap,_fPushClauses_local->iOutCur
                                    ,-1);
                }
                if (_fPushClauses_local->pPars->fNotVerbose == 0) {
                  Abc_Print(1,"Timing out on output %*d in frame %d.\n",(ulong)uVar5,
                            (ulong)(uint)_fPushClauses_local->iOutCur,(ulong)(uint)nOutDigits);
                }
              }
              _fPushClauses_local->timeToStopOne = 0;
            }
          }
        }
      }
      _fPushClauses_local->iOutCur = _fPushClauses_local->iOutCur + 1;
    }
    if (((_fPushClauses_local->pPars->fUseAbs != 0) &&
        (_fPushClauses_local->vAbsFlops != (Vec_Int_t *)0x0)) && (!bVar3)) {
      pVVar14 = _fPushClauses_local->vAbsFlops;
      iVar6 = Vec_IntSize(_fPushClauses_local->vAbsFlops);
      Vec_IntFill(pVVar14,iVar6,0);
      for (k = 0; iVar6 = Vec_VecSize(_fPushClauses_local->vClauses), k < iVar6; k = k + 1) {
        local_98 = 0;
        while( true ) {
          pVVar19 = Vec_VecEntry(_fPushClauses_local->vClauses,k);
          iVar6 = Vec_PtrSize(pVVar19);
          if (iVar6 <= local_98) break;
          pVVar19 = Vec_VecEntry(_fPushClauses_local->vClauses,k);
          pvVar20 = Vec_PtrEntry(pVVar19,local_98);
          for (local_9c = 0; local_9c < *(int *)((long)pvVar20 + 0x10); local_9c = local_9c + 1) {
            pVVar14 = _fPushClauses_local->vAbsFlops;
            iVar6 = Abc_Lit2Var(*(int *)((long)pvVar20 + (long)local_9c * 4 + 0x14));
            Vec_IntWriteEntry(pVVar14,iVar6,1);
          }
          local_98 = local_98 + 1;
        }
      }
    }
    pPVar4 = _fPushClauses_local;
    if (_fPushClauses_local->pPars->fVerbose != 0) {
      aVar12 = Abc_Clock();
      Pdr_ManPrintProgress(pPVar4,(uint)((bVar3 ^ 0xffU) & 1),aVar12 - aVar11);
    }
    if (!bVar3) {
      _fPushClauses_local->nQueLim = _fPushClauses_local->pPars->nRestLimit;
      if (pObj != (Aig_Obj_t *)0x0) {
        __assert_fail("pCube == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                      ,0x2a8,"int IPdr_ManSolveInt(Pdr_Man_t *, int, int)");
      }
      Pdr_ManSetPropertyOutput(_fPushClauses_local,nOutDigits);
      nOutDigits = nOutDigits + 1;
      Pdr_ManCreateSolver(_fPushClauses_local,nOutDigits);
      if (pCube._4_4_ != 0) {
        Abc_Print(1,"*** Clauses after frame %d:\n",(ulong)(uint)nOutDigits);
        Pdr_ManPrintClauses(_fPushClauses_local,0);
      }
      iVar6 = Pdr_ManPushClauses(_fPushClauses_local);
      pPVar4 = _fPushClauses_local;
      if (iVar6 == -1) {
        if (_fPushClauses_local->pPars->fVerbose != 0) {
          aVar12 = Abc_Clock();
          Pdr_ManPrintProgress(pPVar4,1,aVar12 - aVar11);
        }
        if (_fPushClauses_local->pPars->fSilent == 0) {
          if ((_fPushClauses_local->timeToStop == 0) ||
             (aVar11 = Abc_Clock(), aVar11 <= _fPushClauses_local->timeToStop)) {
            Abc_Print(1,"Reached conflict limit (%d) in frame.\n",
                      (ulong)(uint)_fPushClauses_local->pPars->nConfLimit,(ulong)(uint)nOutDigits);
          }
          else {
            Abc_Print(1,"Reached timeout (%d seconds) in frame %d.\n",
                      (ulong)(uint)_fPushClauses_local->pPars->nTimeOut,(ulong)(uint)nOutDigits);
          }
        }
        _fPushClauses_local->pPars->iFrame = nOutDigits;
        return -1;
      }
      if (iVar6 != 0) {
        if (_fPushClauses_local->pPars->fVerbose != 0) {
          aVar12 = Abc_Clock();
          Pdr_ManPrintProgress(pPVar4,1,aVar12 - aVar11);
        }
        if (_fPushClauses_local->pPars->fSilent == 0) {
          Pdr_ManReportInvariant(_fPushClauses_local);
        }
        if (_fPushClauses_local->pPars->fSilent == 0) {
          Pdr_ManVerifyInvariant(_fPushClauses_local);
        }
        _fPushClauses_local->pPars->iFrame = nOutDigits;
        iVar6 = Saig_ManPoNum(_fPushClauses_local->pAig);
        _fPushClauses_local->pPars->nProveOuts =
             (iVar6 - _fPushClauses_local->pPars->nFailOuts) - _fPushClauses_local->pPars->nDropOuts
        ;
        if (_fPushClauses_local->pPars->vOutMap != (Vec_Int_t *)0x0) {
          for (nOutDigits = 0; iVar6 = Saig_ManPoNum(_fPushClauses_local->pAig), nOutDigits < iVar6;
              nOutDigits = nOutDigits + 1) {
            iVar6 = Vec_IntEntry(_fPushClauses_local->pPars->vOutMap,nOutDigits);
            if ((iVar6 == -2) &&
               (Vec_IntWriteEntry(_fPushClauses_local->pPars->vOutMap,nOutDigits,1),
               _fPushClauses_local->pPars->fUseBridge != 0)) {
              Gia_ManToBridgeResult(_stdout,1,(Abc_Cex_t *)0x0,nOutDigits);
            }
          }
        }
        iVar6 = _fPushClauses_local->pPars->nProveOuts;
        iVar8 = Saig_ManPoNum(_fPushClauses_local->pAig);
        if (iVar6 == iVar8) {
          return 1;
        }
        if (0 < _fPushClauses_local->pPars->nFailOuts) {
          return 0;
        }
        return -1;
      }
      if (_fPushClauses_local->pPars->fVerbose != 0) {
        aVar12 = Abc_Clock();
        Pdr_ManPrintProgress(pPVar4,0,aVar12 - aVar11);
      }
      if ((_fPushClauses_local->pPars->pFuncStop != (_func_int_int *)0x0) &&
         (iVar6 = (*_fPushClauses_local->pPars->pFuncStop)(_fPushClauses_local->pPars->RunId),
         iVar6 != 0)) {
        _fPushClauses_local->pPars->iFrame = nOutDigits;
        return -1;
      }
      if ((_fPushClauses_local->timeToStop != 0) &&
         (aVar12 = Abc_Clock(), _fPushClauses_local->timeToStop < aVar12)) {
        if (pCube._4_4_ != 0) {
          Abc_Print(1,"*** Clauses after frame %d:\n",(ulong)(uint)nOutDigits);
          Pdr_ManPrintClauses(_fPushClauses_local,0);
        }
        pPVar4 = _fPushClauses_local;
        if (_fPushClauses_local->pPars->fVerbose != 0) {
          aVar12 = Abc_Clock();
          Pdr_ManPrintProgress(pPVar4,1,aVar12 - aVar11);
        }
        if (_fPushClauses_local->pPars->fSilent == 0) {
          Abc_Print(1,"Reached timeout (%d seconds) in frame %d.\n",
                    (ulong)(uint)_fPushClauses_local->pPars->nTimeOut,(ulong)(uint)nOutDigits);
        }
        _fPushClauses_local->pPars->iFrame = nOutDigits;
        return -1;
      }
      if (((_fPushClauses_local->pPars->nTimeOutGap != 0) &&
          (_fPushClauses_local->pPars->timeLastSolved != 0)) &&
         (aVar12 = Abc_Clock(),
         _fPushClauses_local->pPars->timeLastSolved +
         (long)_fPushClauses_local->pPars->nTimeOutGap * 1000000 < aVar12)) {
        if (pCube._4_4_ != 0) {
          Abc_Print(1,"*** Clauses after frame %d:\n",(ulong)(uint)nOutDigits);
          Pdr_ManPrintClauses(_fPushClauses_local,0);
        }
        pPVar4 = _fPushClauses_local;
        if (_fPushClauses_local->pPars->fVerbose != 0) {
          aVar12 = Abc_Clock();
          Pdr_ManPrintProgress(pPVar4,1,aVar12 - aVar11);
        }
        if (_fPushClauses_local->pPars->fSilent == 0) {
          Abc_Print(1,"Reached gap timeout (%d seconds) in frame %d.\n",
                    (ulong)(uint)_fPushClauses_local->pPars->nTimeOutGap,(ulong)(uint)nOutDigits);
        }
        _fPushClauses_local->pPars->iFrame = nOutDigits;
        return -1;
      }
      pPVar4 = _fPushClauses_local;
      if ((_fPushClauses_local->pPars->nFrameMax != 0) &&
         (_fPushClauses_local->pPars->nFrameMax <= nOutDigits)) {
        if (_fPushClauses_local->pPars->fVerbose != 0) {
          aVar12 = Abc_Clock();
          Pdr_ManPrintProgress(pPVar4,1,aVar12 - aVar11);
        }
        if (_fPushClauses_local->pPars->fSilent == 0) {
          Abc_Print(1,"Reached limit on the number of timeframes (%d).\n",
                    (ulong)(uint)_fPushClauses_local->pPars->nFrameMax);
        }
        _fPushClauses_local->pPars->iFrame = nOutDigits;
        return -1;
      }
    }
  } while( true );
}

Assistant:

int IPdr_ManSolveInt( Pdr_Man_t * p, int fCheckClauses, int fPushClauses )
{
    int fPrintClauses = 0;
    Pdr_Set_t * pCube = NULL;
    Aig_Obj_t * pObj;
    Abc_Cex_t * pCexNew;
    int iFrame, RetValue = -1;
    int nOutDigits = Abc_Base10Log( Saig_ManPoNum(p->pAig) );
    abctime clkStart = Abc_Clock(), clkOne = 0;
    p->timeToStop = p->pPars->nTimeOut ? p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    // assert( Vec_PtrSize(p->vSolvers) == 0 );
    // in the multi-output mode, mark trivial POs (those fed by const0) as solved 
    if ( p->pPars->fSolveAll )
        Saig_ManForEachPo( p->pAig, pObj, iFrame )
            if ( Aig_ObjChild0(pObj) == Aig_ManConst0(p->pAig) )
            {
                Vec_IntWriteEntry( p->pPars->vOutMap, iFrame, 1 ); // unsat
                p->pPars->nProveOuts++;
                if ( p->pPars->fUseBridge )
                    Gia_ManToBridgeResult( stdout, 1, NULL, iFrame );
            }
    // create the first timeframe
    p->pPars->timeLastSolved = Abc_Clock();

    if ( Vec_VecSize(p->vClauses) == 0 )
        Pdr_ManCreateSolver( p, (iFrame = 0) );
    else {
        iFrame = Vec_VecSize(p->vClauses) - 1;

        if ( fCheckClauses )
        {
            if ( p->pPars->fVerbose )
               Abc_Print( 1, "IPDR: Checking the reloaded length-%d trace...", iFrame + 1 ) ;
            IPdr_ManCheckClauses( p );
            if ( p->pPars->fVerbose )
               Abc_Print( 1, " Passed!\n" ) ;
        }

        if ( fPushClauses )
        {
            p->iUseFrame = Abc_MaxInt(iFrame, 1);

            if ( p->pPars->fVerbose ) 
            {
                Abc_Print( 1, "IPDR: Pushing the reloaded clauses. Before:\n" );
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            }

            RetValue = Pdr_ManPushClauses( p );

            if ( p->pPars->fVerbose ) 
            {
                Abc_Print( 1, "IPDR: Finished pushing. After:\n" );
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            }

            if ( RetValue ) 
            {
                Pdr_ManReportInvariant( p );
                Pdr_ManVerifyInvariant( p );
                return 1;
            }
        }

        if ( p->pPars->fUseAbs && p->vAbsFlops == NULL && iFrame >= 1 )
        {
            assert( p->vAbsFlops == NULL );
            p->vAbsFlops  = Vec_IntStart( Saig_ManRegNum(p->pAig) );
            p->vMapFf2Ppi = Vec_IntStartFull( Saig_ManRegNum(p->pAig) );
            p->vMapPpi2Ff = Vec_IntAlloc( 100 );
            
            IPdr_ManRestoreAbsFlops( p );
        }
 
    }
    while ( 1 )
    {
        int fRefined = 0;
        if ( p->pPars->fUseAbs && p->vAbsFlops == NULL && iFrame == 1 )
        {
//            int i, Prio;
            assert( p->vAbsFlops == NULL );
            p->vAbsFlops  = Vec_IntStart( Saig_ManRegNum(p->pAig) );
            p->vMapFf2Ppi = Vec_IntStartFull( Saig_ManRegNum(p->pAig) );
            p->vMapPpi2Ff = Vec_IntAlloc( 100 );
//            Vec_IntForEachEntry( p->vPrio, Prio, i )
//                if ( Prio >> p->nPrioShift  )
//                    Vec_IntWriteEntry( p->vAbsFlops, i, 1 );
        }
        //if ( p->pPars->fUseAbs && p->vAbsFlops )
        //    printf( "Starting frame %d with %d (%d) flops.\n", iFrame, Vec_IntCountPositive(p->vAbsFlops), Vec_IntCountPositive(p->vPrio) );
        p->nFrames = iFrame;
        assert( iFrame == Vec_PtrSize(p->vSolvers)-1 );
        p->iUseFrame = Abc_MaxInt(iFrame, 1);
        Saig_ManForEachPo( p->pAig, pObj, p->iOutCur )
        {
            // skip disproved outputs
            if ( p->vCexes && Vec_PtrEntry(p->vCexes, p->iOutCur) )
                continue;
            // skip output whose time has run out
            if ( p->pTime4Outs && p->pTime4Outs[p->iOutCur] == 0 )
                continue;
            // check if the output is trivially solved
            if ( Aig_ObjChild0(pObj) == Aig_ManConst0(p->pAig) )
                continue;
            // check if the output is trivially solved
            if ( Aig_ObjChild0(pObj) == Aig_ManConst1(p->pAig) )
            {
                if ( !p->pPars->fSolveAll )
                {
                    pCexNew = Abc_CexMakeTriv( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Saig_ManPoNum(p->pAig), iFrame*Saig_ManPoNum(p->pAig)+p->iOutCur );
                    p->pAig->pSeqModel = pCexNew;
                    return 0; // SAT
                }
                pCexNew = (p->pPars->fUseBridge || p->pPars->fStoreCex) ? Abc_CexMakeTriv( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Saig_ManPoNum(p->pAig), iFrame*Saig_ManPoNum(p->pAig)+p->iOutCur ) : (Abc_Cex_t *)(ABC_PTRINT_T)1;
                p->pPars->nFailOuts++;
                if ( p->pPars->vOutMap ) Vec_IntWriteEntry( p->pPars->vOutMap, p->iOutCur, 0 );
                if ( !p->pPars->fNotVerbose )
                Abc_Print( 1, "Output %*d was trivially asserted in frame %2d (solved %*d out of %*d outputs).\n",
                    nOutDigits, p->iOutCur, iFrame, nOutDigits, p->pPars->nFailOuts, nOutDigits, Saig_ManPoNum(p->pAig) );
                assert( Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL );
                if ( p->pPars->fUseBridge )
                    Gia_ManToBridgeResult( stdout, 0, pCexNew, pCexNew->iPo );
                Vec_PtrWriteEntry( p->vCexes, p->iOutCur, pCexNew );
                if ( p->pPars->pFuncOnFail && p->pPars->pFuncOnFail(p->iOutCur, p->pPars->fStoreCex ? (Abc_Cex_t *)Vec_PtrEntry(p->vCexes, p->iOutCur) : NULL) )
                {
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                    if ( !p->pPars->fSilent )
                        Abc_Print( 1, "Quitting due to callback on fail in frame %d.\n", iFrame );
                    p->pPars->iFrame = iFrame;
                    return -1;
                }
                if ( p->pPars->nFailOuts + p->pPars->nDropOuts == Saig_ManPoNum(p->pAig) )
                    return p->pPars->nFailOuts ? 0 : -1; // SAT or UNDEC
                p->pPars->timeLastSolved = Abc_Clock();
                continue;
            }
            // try to solve this output
            if ( p->pTime4Outs )
            {
                assert( p->pTime4Outs[p->iOutCur] > 0 );
                clkOne = Abc_Clock();
                p->timeToStopOne = p->pTime4Outs[p->iOutCur] + Abc_Clock();
            }
            while ( 1 )
            {
                if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
                {
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                    if ( !p->pPars->fSilent )
                        Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
                    p->pPars->iFrame = iFrame;
                    return -1;
                }
                RetValue = Pdr_ManCheckCube( p, iFrame, NULL, &pCube, p->pPars->nConfLimit, 0, 1 );
                if ( RetValue == 1 )
                    break;
                if ( RetValue == -1 )
                {
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                    if ( p->timeToStop && Abc_Clock() > p->timeToStop )
                        Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
                    else if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
                        Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
                    else if ( p->timeToStopOne && Abc_Clock() > p->timeToStopOne )
                    {
                        Pdr_QueueClean( p );
                        pCube = NULL;
                        break; // keep solving
                    }
                    else if ( p->pPars->nConfLimit )
                        Abc_Print( 1, "Reached conflict limit (%d) in frame %d.\n",  p->pPars->nConfLimit, iFrame );
                    else if ( p->pPars->fVerbose )
                        Abc_Print( 1, "Computation cancelled by the callback in frame %d.\n", iFrame );
                    p->pPars->iFrame = iFrame;
                    return -1;
                }
                if ( RetValue == 0 )
                {
                    RetValue = Pdr_ManBlockCube( p, pCube );
                    if ( RetValue == -1 )
                    {
                        if ( p->pPars->fVerbose )
                            Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                        if ( p->timeToStop && Abc_Clock() > p->timeToStop )
                            Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
                        else if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
                            Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
                        else if ( p->timeToStopOne && Abc_Clock() > p->timeToStopOne )
                        {
                            Pdr_QueueClean( p );
                            pCube = NULL;
                            break; // keep solving
                        }
                        else if ( p->pPars->nConfLimit )
                            Abc_Print( 1, "Reached conflict limit (%d) in frame %d.\n",  p->pPars->nConfLimit, iFrame );
                        else if ( p->pPars->fVerbose )
                            Abc_Print( 1, "Computation cancelled by the callback in frame %d.\n", iFrame );
                        p->pPars->iFrame = iFrame;
                        return -1;
                    }
                    if ( RetValue == 0 )
                    {
                        if ( fPrintClauses )
                        {
                            Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
                            Pdr_ManPrintClauses( p, 0 );
                        }
                        if ( p->pPars->fVerbose && !p->pPars->fUseAbs )
                            Pdr_ManPrintProgress( p, !p->pPars->fSolveAll, Abc_Clock() - clkStart );
                        p->pPars->iFrame = iFrame;
                        if ( !p->pPars->fSolveAll )
                        {
                            abctime clk = Abc_Clock();
                            Abc_Cex_t * pCex = Pdr_ManDeriveCexAbs(p);
                            p->tAbs += Abc_Clock() - clk;
                            if ( pCex == NULL )
                            {
                                assert( p->pPars->fUseAbs );
                                Pdr_QueueClean( p );
                                pCube = NULL;
                                fRefined = 1;
                                break; // keep solving
                            }
                            p->pAig->pSeqModel = pCex;

                            if ( p->pPars->fVerbose && p->pPars->fUseAbs )
                                Pdr_ManPrintProgress( p, !p->pPars->fSolveAll, Abc_Clock() - clkStart );
                            return 0; // SAT
                        }
                        p->pPars->nFailOuts++;
                        pCexNew = (p->pPars->fUseBridge || p->pPars->fStoreCex) ? Pdr_ManDeriveCex(p) : (Abc_Cex_t *)(ABC_PTRINT_T)1;
                        if ( p->pPars->vOutMap ) Vec_IntWriteEntry( p->pPars->vOutMap, p->iOutCur, 0 );
                        assert( Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL );
                        if ( p->pPars->fUseBridge )
                            Gia_ManToBridgeResult( stdout, 0, pCexNew, pCexNew->iPo );
                        Vec_PtrWriteEntry( p->vCexes, p->iOutCur, pCexNew );
                        if ( p->pPars->pFuncOnFail && p->pPars->pFuncOnFail(p->iOutCur, p->pPars->fStoreCex ? (Abc_Cex_t *)Vec_PtrEntry(p->vCexes, p->iOutCur) : NULL) )
                        {
                            if ( p->pPars->fVerbose )
                                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
                            if ( !p->pPars->fSilent )
                                Abc_Print( 1, "Quitting due to callback on fail in frame %d.\n", iFrame );
                            p->pPars->iFrame = iFrame;
                            return -1;
                        }
                        if ( !p->pPars->fNotVerbose )
                            Abc_Print( 1, "Output %*d was asserted in frame %2d (%2d) (solved %*d out of %*d outputs).\n",
                                nOutDigits, p->iOutCur, iFrame, iFrame, nOutDigits, p->pPars->nFailOuts, nOutDigits, Saig_ManPoNum(p->pAig) );
                        if ( p->pPars->nFailOuts == Saig_ManPoNum(p->pAig) )
                            return 0; // all SAT
                        Pdr_QueueClean( p );
                        pCube = NULL;
                        break; // keep solving
                    }
                    if ( p->pPars->fVerbose )
                        Pdr_ManPrintProgress( p, 0, Abc_Clock() - clkStart );
                }
            }
            if ( fRefined )
                break;
            if ( p->pTime4Outs )
            {
                abctime timeSince = Abc_Clock() - clkOne;
                assert( p->pTime4Outs[p->iOutCur] > 0 );
                p->pTime4Outs[p->iOutCur] = (p->pTime4Outs[p->iOutCur] > timeSince) ? p->pTime4Outs[p->iOutCur] - timeSince : 0;
                if ( p->pTime4Outs[p->iOutCur] == 0 && Vec_PtrEntry(p->vCexes, p->iOutCur) == NULL ) // undecided
                {
                    p->pPars->nDropOuts++;
                    if ( p->pPars->vOutMap ) 
                        Vec_IntWriteEntry( p->pPars->vOutMap, p->iOutCur, -1 );
                    if ( !p->pPars->fNotVerbose ) 
                        Abc_Print( 1, "Timing out on output %*d in frame %d.\n", nOutDigits, p->iOutCur, iFrame );
                }
                p->timeToStopOne = 0;
            }
        }
        /*
        if ( p->pPars->fUseAbs && p->vAbsFlops && !fRefined )
        {
            int i, Used;
            Vec_IntForEachEntry( p->vAbsFlops, Used, i )
                if ( Used && (Vec_IntEntry(p->vPrio, i) >> p->nPrioShift) == 0 )
                    Vec_IntWriteEntry( p->vAbsFlops, i, 0 );
        }
        */
        if ( p->pPars->fUseAbs && p->vAbsFlops && !fRefined )
        {
            Pdr_Set_t * pSet;
            int i, j, k;
            Vec_IntFill( p->vAbsFlops, Vec_IntSize( p->vAbsFlops ), 0 );
            Vec_VecForEachEntry( Pdr_Set_t *, p->vClauses, pSet, i, j )
                for ( k = 0; k < pSet->nLits; k++ )
                    Vec_IntWriteEntry( p->vAbsFlops, Abc_Lit2Var(pSet->Lits[k]), 1 );
        }

        if ( p->pPars->fVerbose )
            Pdr_ManPrintProgress( p, !fRefined, Abc_Clock() - clkStart );
        if ( fRefined )
            continue;
        //if ( p->pPars->fUseAbs && p->vAbsFlops )
        //    printf( "Finished frame %d with %d (%d) flops.\n", iFrame, Vec_IntCountPositive(p->vAbsFlops), Vec_IntCountPositive(p->vPrio) );
        // open a new timeframe
        p->nQueLim = p->pPars->nRestLimit;
        assert( pCube == NULL );
        Pdr_ManSetPropertyOutput( p, iFrame );
        Pdr_ManCreateSolver( p, ++iFrame );
        if ( fPrintClauses )
        {
            Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
            Pdr_ManPrintClauses( p, 0 );
        }
        // push clauses into this timeframe
        RetValue = Pdr_ManPushClauses( p );
        if ( RetValue == -1 )
        {
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
            {
                if ( p->timeToStop && Abc_Clock() > p->timeToStop )
                    Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
                else
                    Abc_Print( 1, "Reached conflict limit (%d) in frame.\n",  p->pPars->nConfLimit, iFrame );
            }
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( RetValue )
        {
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Pdr_ManReportInvariant( p );
            if ( !p->pPars->fSilent )
                Pdr_ManVerifyInvariant( p );
            p->pPars->iFrame = iFrame;
            // count the number of UNSAT outputs
            p->pPars->nProveOuts = Saig_ManPoNum(p->pAig) - p->pPars->nFailOuts - p->pPars->nDropOuts;
            // convert previously 'unknown' into 'unsat'
            if ( p->pPars->vOutMap )
                for ( iFrame = 0; iFrame < Saig_ManPoNum(p->pAig); iFrame++ )
                    if ( Vec_IntEntry(p->pPars->vOutMap, iFrame) == -2 ) // unknown
                    {
                        Vec_IntWriteEntry( p->pPars->vOutMap, iFrame, 1 ); // unsat
                        if ( p->pPars->fUseBridge )
                            Gia_ManToBridgeResult( stdout, 1, NULL, iFrame );
                    }
            if ( p->pPars->nProveOuts == Saig_ManPoNum(p->pAig) )
                return 1; // UNSAT
            if ( p->pPars->nFailOuts > 0 )
                return 0; // SAT
            return -1;
        }
        if ( p->pPars->fVerbose )
            Pdr_ManPrintProgress( p, 0, Abc_Clock() - clkStart );

        // check termination
        if ( p->pPars->pFuncStop && p->pPars->pFuncStop(p->pPars->RunId) )
        {
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( p->timeToStop && Abc_Clock() > p->timeToStop )
        {
            if ( fPrintClauses )
            {
                Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
                Pdr_ManPrintClauses( p, 0 );
            }
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Abc_Print( 1, "Reached timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOut, iFrame );
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( p->pPars->nTimeOutGap && p->pPars->timeLastSolved && Abc_Clock() > p->pPars->timeLastSolved + p->pPars->nTimeOutGap * CLOCKS_PER_SEC )
        {
            if ( fPrintClauses )
            {
                Abc_Print( 1, "*** Clauses after frame %d:\n", iFrame );
                Pdr_ManPrintClauses( p, 0 );
            }
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Abc_Print( 1, "Reached gap timeout (%d seconds) in frame %d.\n",  p->pPars->nTimeOutGap, iFrame );
            p->pPars->iFrame = iFrame;
            return -1;
        }
        if ( p->pPars->nFrameMax && iFrame >= p->pPars->nFrameMax )
        {
            if ( p->pPars->fVerbose )
                Pdr_ManPrintProgress( p, 1, Abc_Clock() - clkStart );
            if ( !p->pPars->fSilent )
                Abc_Print( 1, "Reached limit on the number of timeframes (%d).\n", p->pPars->nFrameMax );
            p->pPars->iFrame = iFrame;
            return -1;
        }
    }
    assert( 0 );
    return -1;
}